

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

MESSAGE_HANDLE
create_amqp_message_for_twin_operation
          (TWIN_OPERATION_TYPE op_type,char *correlation_id,CONSTBUFFER_HANDLE data)

{
  BINARY_DATA amqp_data;
  int iVar1;
  char *value;
  LOGGER_LOG p_Var2;
  AMQP_VALUE map;
  CONSTBUFFER *pCVar3;
  LOGGER_LOG l_7;
  CONSTBUFFER *data_buffer;
  BINARY_DATA binary_data;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE msg_annotations_map;
  LOGGER_LOG l;
  char *twin_op_name;
  MESSAGE_HANDLE result;
  CONSTBUFFER_HANDLE data_local;
  char *correlation_id_local;
  TWIN_OPERATION_TYPE op_type_local;
  
  value = get_twin_operation_name(op_type);
  if (value == (char *)0x0) {
    twin_op_name = (char *)0x0;
  }
  else {
    twin_op_name = (char *)message_create();
    if ((MESSAGE_HANDLE)twin_op_name == (MESSAGE_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"create_amqp_message_for_twin_operation",0x2ee,1,
                  "Failed creating AMQP message (%s)",value);
      }
    }
    else {
      map = amqpvalue_create_map();
      if (map == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"create_amqp_message_for_twin_operation",0x2f6,1,
                    "Failed creating map for message annotations");
        }
        message_destroy((MESSAGE_HANDLE)twin_op_name);
        twin_op_name = (char *)0x0;
      }
      else {
        iVar1 = add_map_item(map,"operation",value);
        if (iVar1 == 0) {
          if ((op_type == TWIN_OPERATION_TYPE_PATCH) &&
             (iVar1 = add_map_item(map,"resource","/properties/reported"), iVar1 != 0)) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"create_amqp_message_for_twin_operation",0x305,1,
                        "Failed adding resource to AMQP message annotations (%s)",value);
            }
            message_destroy((MESSAGE_HANDLE)twin_op_name);
            twin_op_name = (char *)0x0;
          }
          else if (((op_type == TWIN_OPERATION_TYPE_PUT) || (op_type == TWIN_OPERATION_TYPE_DELETE))
                  && (iVar1 = add_map_item(map,"resource","/notifications/twin/properties/desired"),
                     iVar1 != 0)) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"create_amqp_message_for_twin_operation",0x30c,1,
                        "Failed adding resource to AMQP message annotations (%s)",value);
            }
            message_destroy((MESSAGE_HANDLE)twin_op_name);
            twin_op_name = (char *)0x0;
          }
          else {
            iVar1 = add_amqp_message_annotation((MESSAGE_HANDLE)twin_op_name,map);
            if (iVar1 == 0) {
              iVar1 = set_message_correlation_id((MESSAGE_HANDLE)twin_op_name,correlation_id);
              if (iVar1 == 0) {
                if (data == (CONSTBUFFER_HANDLE)0x0) {
                  data_buffer = (CONSTBUFFER *)0x1f647f;
                  binary_data.bytes = (uchar *)0x1;
                }
                else {
                  pCVar3 = CONSTBUFFER_GetContent(data);
                  data_buffer = (CONSTBUFFER *)pCVar3->buffer;
                  binary_data.bytes = (uchar *)pCVar3->size;
                }
                amqp_data.length = (size_t)binary_data.bytes;
                amqp_data.bytes = (uchar *)data_buffer;
                iVar1 = message_add_body_amqp_data((MESSAGE_HANDLE)twin_op_name,amqp_data);
                if (iVar1 != 0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                              ,"create_amqp_message_for_twin_operation",0x32f,1,
                              "Failed adding twin patch data to AMQP message body");
                  }
                  message_destroy((MESSAGE_HANDLE)twin_op_name);
                  twin_op_name = (char *)0x0;
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                            ,"create_amqp_message_for_twin_operation",0x318,1,
                            "Failed AMQP message correlation-id (%s)",value);
                }
                message_destroy((MESSAGE_HANDLE)twin_op_name);
                twin_op_name = (char *)0x0;
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"create_amqp_message_for_twin_operation",0x312,1,
                          "Failed adding annotations to AMQP message (%s)",value);
              }
              message_destroy((MESSAGE_HANDLE)twin_op_name);
              twin_op_name = (char *)0x0;
            }
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"create_amqp_message_for_twin_operation",0x2fe,1,
                      "Failed adding operation to AMQP message annotations (%s)",value);
          }
          message_destroy((MESSAGE_HANDLE)twin_op_name);
          twin_op_name = (char *)0x0;
        }
        amqpvalue_destroy(map);
      }
    }
  }
  return (MESSAGE_HANDLE)twin_op_name;
}

Assistant:

static MESSAGE_HANDLE create_amqp_message_for_twin_operation(TWIN_OPERATION_TYPE op_type, char* correlation_id, CONSTBUFFER_HANDLE data)
{
    MESSAGE_HANDLE result;
    const char* twin_op_name;

    if ((twin_op_name = get_twin_operation_name(op_type))== NULL)
    {
        result = NULL;
    }
    else if ((result = message_create()) == NULL)
    {
        LogError("Failed creating AMQP message (%s)", twin_op_name);
    }
    else
    {
        AMQP_VALUE msg_annotations_map;

        if ((msg_annotations_map = amqpvalue_create_map()) == NULL)
        {
            LogError("Failed creating map for message annotations");
            message_destroy(result);
            result = NULL;
        }
        else
        {
            if (add_map_item(msg_annotations_map, TWIN_MESSAGE_PROPERTY_OPERATION, twin_op_name) != RESULT_OK)
            {
                LogError("Failed adding operation to AMQP message annotations (%s)", twin_op_name);
                message_destroy(result);
                result = NULL;
            }
            else if ((op_type == TWIN_OPERATION_TYPE_PATCH) &&
                add_map_item(msg_annotations_map, TWIN_MESSAGE_PROPERTY_RESOURCE, TWIN_RESOURCE_REPORTED) != RESULT_OK)
            {
                LogError("Failed adding resource to AMQP message annotations (%s)", twin_op_name);
                message_destroy(result);
                result = NULL;
            }
            else if ((op_type == TWIN_OPERATION_TYPE_PUT || op_type == TWIN_OPERATION_TYPE_DELETE) &&
                add_map_item(msg_annotations_map, TWIN_MESSAGE_PROPERTY_RESOURCE, TWIN_RESOURCE_DESIRED) != RESULT_OK)
            {
                LogError("Failed adding resource to AMQP message annotations (%s)", twin_op_name);
                message_destroy(result);
                result = NULL;
            }
            else if (add_amqp_message_annotation(result, msg_annotations_map) != RESULT_OK)
            {
                LogError("Failed adding annotations to AMQP message (%s)", twin_op_name);
                message_destroy(result);
                result = NULL;
            }
            else if (set_message_correlation_id(result, correlation_id) != RESULT_OK)
            {
                LogError("Failed AMQP message correlation-id (%s)", twin_op_name);
                message_destroy(result);
                result = NULL;
            }
            else
            {
                BINARY_DATA binary_data;

                if (data != NULL)
                {
                    const CONSTBUFFER* data_buffer;
                    data_buffer = CONSTBUFFER_GetContent(data);
                    binary_data.bytes = data_buffer->buffer;
                    binary_data.length = data_buffer->size;
                }
                else
                {
                    binary_data.bytes = EMPTY_TWIN_BODY_DATA;
                    binary_data.length = EMPTY_TWIN_BODY_SIZE;
                }

                if (message_add_body_amqp_data(result, binary_data) != 0)
                {
                    LogError("Failed adding twin patch data to AMQP message body");
                    message_destroy(result);
                    result = NULL;
                }
            }

            amqpvalue_destroy(msg_annotations_map);
        }
    }

    return result;
}